

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O3

void tp_destroy(thread_pool_t *tp)

{
  int iVar1;
  long lVar2;
  
  if (tp == (thread_pool_t *)0x0) {
    return;
  }
  if (tp->threads != (pthread_t *)0x0) {
    if (0 < (int)tp->nthread) {
      lVar2 = 0;
      do {
        iVar1 = pthread_cancel(tp->threads[lVar2]);
        if (iVar1 != 0) {
          perror("pthread_cancel() failed");
        }
        lVar2 = lVar2 + 1;
      } while (lVar2 < (int)tp->nthread);
    }
    tp_join(tp);
    free(tp->threads);
  }
  iVar1 = pthread_cond_destroy((pthread_cond_t *)&tp->has_task);
  if (iVar1 != 0) {
    perror("pthread_cond_destroy() failed");
  }
  iVar1 = pthread_mutex_destroy((pthread_mutex_t *)&tp->lock);
  if (iVar1 != 0) {
    perror("pthread_mutex_destroy()");
  }
  if (g_self_key_inited == '\x01') {
    tp_tls_destroy(&g_self_tls);
    g_self_key_inited = '\0';
  }
  queue_clear(&tp->task_queue);
  memset(tp,0,0xb8);
  return;
}

Assistant:

void tp_destroy(thread_pool_t *tp)
{
    int i;

    if (tp == NULL) {
        return;
    }

    if (tp->threads) {
        for (i = 0; i < (int) tp->nthread; ++i) {
            // todo: check return value
            if (pthread_cancel(tp->threads[i])) {
                perror("pthread_cancel() failed");
            }
        }

        tp_join(tp);

        free(tp->threads);
    }

    if (pthread_cond_destroy(&tp->has_task)) {
        perror("pthread_cond_destroy() failed");
    }

    if (pthread_mutex_destroy(&tp->lock)) {
        perror("pthread_mutex_destroy()");
    }

    if (g_self_key_inited) {
        _tp_self_destroy(tp);
        g_self_key_inited = false;
    }

    queue_clear(&tp->task_queue);

    bzero(tp, sizeof(thread_pool_t));
}